

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Reference>
          (AsciiParser *this,
          vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result)

{
  bool bVar1;
  char c;
  bool triple_deliminated;
  char ce;
  
  bVar1 = SkipWhitespace(this);
  if ((bVar1) && (bVar1 = Char1(this,&c), bVar1)) {
    if (c == '[') {
      bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (bVar1) {
        bVar1 = Char1(this,&ce);
        if (!bVar1) {
          return bVar1;
        }
        if (ce == ']') {
          ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::clear(result);
          return bVar1;
        }
        Rewind(this,1);
        bVar1 = SepBy1BasicType<tinyusdz::Reference>(this,',',']',result);
        if (((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) &&
           (bVar1 = Expect(this,']'), bVar1)) {
          return true;
        }
      }
    }
    else {
      Rewind(this,1);
      Reference::Reference((Reference *)&ce);
      triple_deliminated = false;
      bVar1 = ParseReference(this,(Reference *)&ce,&triple_deliminated);
      if (bVar1) {
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::clear(result);
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                  (result,(Reference *)&ce);
        Reference::~Reference((Reference *)&ce);
        return true;
      }
      Reference::~Reference((Reference *)&ce);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Reference> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    return false;
  }

  if (c != '[') {
    Rewind(1);

    // Guess non-list version
    Reference ref;
    bool triple_deliminated{false};
    if (!ParseReference(&ref, &triple_deliminated)) {
      return false;
    }

    (void)triple_deliminated;
    result->clear();
    result->push_back(ref);

  } else {

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // Empty array?
    {
      char ce;
      if (!Char1(&ce)) {
        return false;
      }

      if (ce == ']') {
        result->clear();
        return true;
      }

      Rewind(1);
    }


    if (!SepBy1BasicType<Reference>(',', ']', result)) {
      return false;
    }
    DCOUT("parsed ref array");

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (!Expect(']')) {
      return false;
    }

  }

  return true;
}